

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse2_128_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  int64_t iVar12;
  ulong uVar13;
  int imm_00;
  long extraout_RDX;
  int imm_01;
  long extraout_RDX_00;
  long extraout_RDX_01;
  int *col;
  undefined4 in_register_00000084;
  ulong uVar15;
  undefined4 in_register_0000008c;
  ulong uVar16;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i a_21;
  __m128i a_22;
  __m128i a_23;
  __m128i a_24;
  __m128i a_25;
  __m128i a_26;
  __m128i a_27;
  __m128i a_28;
  __m128i a_29;
  __m128i a_30;
  __m128i a_31;
  __m128i a_32;
  __m128i a_33;
  __m128i a_34;
  __m128i a_35;
  __m128i a_36;
  __m128i a_37;
  __m128i a_38;
  __m128i a_39;
  __m128i a_40;
  __m128i a_41;
  __m128i a_42;
  __m128i a_43;
  __m128i a_44;
  __m128i a_45;
  __m128i a_46;
  __m128i a_47;
  __m128i a_48;
  __m128i a_49;
  __m128i a_50;
  __m128i a_51;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i b_20;
  __m128i b_21;
  __m128i b_22;
  __m128i b_23;
  __m128i b_24;
  __m128i b_25;
  __m128i b_26;
  __m128i b_27;
  __m128i b_28;
  __m128i b_29;
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  __m128i vWH_03;
  __m128i b_30;
  __m128i b_31;
  __m128i b_32;
  __m128i b_33;
  __m128i b_34;
  __m128i b_35;
  __m128i b_36;
  __m128i b_37;
  __m128i alVar17;
  __m128i alVar18;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i mask_06;
  __m128i mask_07;
  __m128i mask_08;
  __m128i mask_09;
  __m128i mask_10;
  __m128i mask_11;
  __m128i mask_12;
  __m128i mask_13;
  __m128i mask_14;
  __m128i mask_15;
  __m128i mask_16;
  undefined8 in_stack_fffffffffffff498;
  undefined8 in_stack_fffffffffffff4a0;
  int local_aec;
  int64_t local_ae8;
  int local_acc;
  long local_ac8;
  int local_aa4;
  int64_t value;
  __m128i cond_all;
  __m128i cond_valid_J;
  __m128i cond_valid_I;
  __m128i cond;
  __m128i vNWL;
  __m128i vNWS;
  __m128i vNWM;
  __m128i vNWH;
  __m128i vMat;
  int *matrow1;
  int *matrow0;
  __m128i vs2;
  __m128i vs1;
  __m128i vJ;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF_opn;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE_opn;
  __m128i vE;
  __m128i vWL;
  __m128i vWS;
  __m128i vWM;
  __m128i vWH;
  __m128i vNL;
  __m128i vNS;
  __m128i vNM;
  __m128i vNH;
  __m128i case2;
  __m128i case1;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vNegInf0;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  long local_6e0;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int64_t *FL_pr;
  int64_t *FS_pr;
  int64_t *FM_pr;
  int64_t *F_pr;
  int64_t *HL_pr;
  int64_t *HS_pr;
  int64_t *HM_pr;
  int64_t *H_pr;
  int64_t *s2;
  int64_t *_FL_pr;
  int64_t *_FS_pr;
  int64_t *_FM_pr;
  int64_t *_F_pr;
  int64_t *_HL_pr;
  int64_t *_HS_pr;
  int64_t *_HM_pr;
  int64_t *_H_pr;
  int64_t *s2B;
  int64_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  int imm;
  longlong lVar14;
  
  uVar16 = CONCAT44(in_register_0000008c,gap);
  uVar15 = CONCAT44(in_register_00000084,open);
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse2_128_64","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_diag_sse2_128_64","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_diag_sse2_128_64","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_diag_sse2_128_64","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse2_128_64","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_nw_stats_rowcol_diag_sse2_128_64");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse2_128_64","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_diag_sse2_128_64","_s1Len")
        ;
        return (parasail_result_t *)0x0;
      }
    }
    local_aa4 = _s1Len;
    if (matrix->type != 0) {
      local_aa4 = matrix->length;
    }
    NEG_LIMIT._4_4_ = local_aa4 + -1;
    NEG_LIMIT._0_4_ = s2Len + -1;
    if (-open < matrix->min) {
      alVar18[0] = (long)open;
    }
    else {
      alVar18[0] = -(long)matrix->min;
    }
    local_6e0 = alVar18[0] + -0x7fffffffffffffff;
    alVar17[1] = 1;
    alVar17[0] = local_6e0;
    _mm_insert_epi64_rpl(alVar17,(int64_t)_s2,matrix->max);
    _s1_local = (char *)parasail_result_new_rowcol3(local_aa4,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x2811001;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40000;
      ptr = parasail_memalign_int64_t(0x10,(long)(local_aa4 + 1));
      ptr_00 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_01 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_02 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_03 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_04 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_05 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_06 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_07 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      col = (int *)(long)(s2Len + 2);
      alVar18[0] = 0x10;
      ptr_08 = parasail_memalign_int64_t(0x10,(size_t)col);
      if (ptr == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_03 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_04 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_05 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_06 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_07 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_08 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        b_09[1] = extraout_RDX;
        for (end_query = 0; end_query < local_aa4; end_query = end_query + 1) {
          b_09[1] = (long)matrix->mapper[(byte)_s1[end_query]];
          ptr[end_query] = b_09[1];
        }
        for (end_query = local_aa4; end_query < local_aa4 + 1; end_query = end_query + 1) {
          ptr[end_query] = 0;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          b_09[1] = (long)matrix->mapper[(byte)_s2[end_ref]];
          ptr_00[(long)end_ref + 1] = b_09[1];
        }
        for (end_ref = -1; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 1] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 1) {
          ptr_00[(long)end_ref + 1] = 0;
          iVar1 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 1] = (long)(-(end_ref * gap) - open);
          ptr_02[(long)end_ref + 1] = 0;
          ptr_03[(long)end_ref + 1] = 0;
          ptr_04[(long)end_ref + 1] = 0;
          ptr_05[(long)end_ref + 1] = local_6e0;
          ptr_06[(long)end_ref + 1] = 0;
          ptr_07[(long)end_ref + 1] = 0;
          ptr_08[(long)end_ref + 1] = 0;
          b_09[1] = local_6e0;
        }
        for (end_ref = -1; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 1] = 0;
          ptr_02[(long)end_ref + 1] = 0;
          ptr_03[(long)end_ref + 1] = 0;
          ptr_04[(long)end_ref + 1] = 0;
          ptr_05[(long)end_ref + 1] = 0;
          ptr_06[(long)end_ref + 1] = 0;
          ptr_07[(long)end_ref + 1] = 0;
          ptr_08[(long)end_ref + 1] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 1) {
          ptr_01[(long)end_ref + 1] = 0;
          ptr_02[(long)end_ref + 1] = 0;
          ptr_03[(long)end_ref + 1] = 0;
          ptr_04[(long)end_ref + 1] = 0;
          ptr_05[(long)end_ref + 1] = 0;
          ptr_06[(long)end_ref + 1] = 0;
          ptr_07[(long)end_ref + 1] = 0;
          ptr_08[(long)end_ref + 1] = 0;
          iVar1 = end_ref + 1;
        }
        *ptr_01 = 0;
        for (end_query = 0; uVar13 = (ulong)(s2Len + 1), end_query < local_aa4;
            end_query = end_query + 2) {
          piVar2 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_ac8 = ptr[end_query];
          }
          else {
            if (end_query < local_aa4) {
              local_acc = end_query;
            }
            else {
              local_acc = local_aa4 + -1;
            }
            local_ac8 = (long)local_acc;
          }
          if (matrix->type == 0) {
            local_ae8 = ptr[end_query + 1];
          }
          else {
            if (end_query + 1 < local_aa4) {
              local_aec = end_query + 1;
            }
            else {
              local_aec = local_aa4 + -1;
            }
            local_ae8 = (int64_t)local_aec;
          }
          a[1] = 1;
          a[0] = *ptr_01;
          alVar17 = _mm_insert_epi64_rpl(a,local_ae8,matrix->size * (int)local_ae8 * 4);
          alVar18[0] = (long)(-(end_query * gap) - open);
          alVar18[1] = 1;
          col = (int *)0x1;
          alVar17 = _mm_insert_epi64_rpl(alVar18,alVar17[1],end_query * gap);
          b_09[1] = alVar17[1];
          *ptr_01 = (long)(-((end_query + 2) * gap) - open);
          for (end_ref = 0; end_ref < s2Len + 1; end_ref = end_ref + 1) {
            a_00[1] = 1;
            a_00[0] = ptr_01[(long)end_ref + 1];
            alVar18 = _mm_insert_epi64_rpl(a_00,b_09[1],end_ref);
            a_01[1]._0_4_ = 1;
            a_01[0] = ptr_02[(long)end_ref + 1];
            a_01[1]._4_4_ = 0;
            alVar18 = _mm_insert_epi64_rpl(a_01,alVar18[1],end_ref);
            a_02[1]._0_4_ = 1;
            a_02[0] = ptr_03[(long)end_ref + 1];
            a_02[1]._4_4_ = 0;
            alVar18 = _mm_insert_epi64_rpl(a_02,alVar18[1],end_ref);
            a_03[1]._0_4_ = 1;
            a_03[0] = ptr_04[(long)end_ref + 1];
            a_03[1]._4_4_ = 0;
            alVar18 = _mm_insert_epi64_rpl(a_03,alVar18[1],end_ref);
            a_04[1]._0_4_ = 1;
            a_04[0] = ptr_05[(long)end_ref + 1];
            a_04[1]._4_4_ = 0;
            alVar18 = _mm_insert_epi64_rpl(a_04,alVar18[1],end_ref);
            a_05[1]._0_4_ = 1;
            a_05[0] = ptr_06[(long)end_ref + 1];
            a_05[1]._4_4_ = 0;
            alVar18 = _mm_insert_epi64_rpl(a_05,alVar18[1],end_ref);
            a_06[1]._0_4_ = 1;
            a_06[0] = ptr_07[(long)end_ref + 1];
            a_06[1]._4_4_ = 0;
            alVar17 = _mm_insert_epi64_rpl(a_06,alVar18[1],end_ref);
            alVar18[0] = (long)end_ref;
            iVar12 = ptr_08[alVar18[0] + 1];
            a_07[1]._0_4_ = 1;
            a_07[0] = iVar12;
            a_07[1]._4_4_ = 0;
            lVar14 = 1;
            alVar17 = _mm_insert_epi64_rpl(a_07,alVar17[1],end_ref);
            b[0] = alVar17[1];
            a_08[1] = lVar14;
            a_08[0] = iVar12;
            b[1] = alVar18[0];
            alVar17 = _mm_max_epi64_rpl(a_08,b);
            b_00[0] = alVar17[1];
            a_09[1] = lVar14;
            a_09[0] = iVar12;
            b_00[1] = alVar18[0];
            alVar17 = _mm_cmpgt_epi64_rpl(a_09,b_00);
            b_01[0] = alVar17[1];
            a_10[1] = lVar14;
            a_10[0] = iVar12;
            b_01[1] = alVar18[0];
            mask[1] = uVar16;
            mask[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_10,b_01,mask);
            b_02[0] = alVar17[1];
            a_11[1] = lVar14;
            a_11[0] = iVar12;
            b_02[1] = alVar18[0];
            mask_00[1] = uVar16;
            mask_00[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_11,b_02,mask_00);
            b_03[0] = alVar17[1];
            a_12[1] = lVar14;
            a_12[0] = iVar12;
            b_03[1] = alVar18[0];
            mask_01[1] = uVar16;
            mask_01[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_12,b_03,mask_01);
            b_04[0] = alVar17[1];
            a_13[1] = lVar14;
            a_13[0] = iVar12;
            b_04[1] = alVar18[0];
            alVar17 = _mm_max_epi64_rpl(a_13,b_04);
            b_05[0] = alVar17[1];
            a_14[1] = lVar14;
            a_14[0] = iVar12;
            b_05[1] = alVar18[0];
            alVar17 = _mm_cmpgt_epi64_rpl(a_14,b_05);
            b_06[0] = alVar17[1];
            a_15[1] = lVar14;
            a_15[0] = iVar12;
            b_06[1] = alVar18[0];
            mask_02[1] = uVar16;
            mask_02[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_15,b_06,mask_02);
            b_07[0] = alVar17[1];
            a_16[1] = lVar14;
            a_16[0] = iVar12;
            b_07[1] = alVar18[0];
            mask_03[1] = uVar16;
            mask_03[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_16,b_07,mask_03);
            b_08[0] = alVar17[1];
            a_17[1] = lVar14;
            a_17[0] = iVar12;
            b_08[1] = alVar18[0];
            mask_04[1] = uVar16;
            mask_04[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_17,b_08,mask_04);
            iVar12 = ptr_00[(long)end_ref + 1];
            a_18[1]._0_4_ = 1;
            a_18[0] = iVar12;
            a_18[1]._4_4_ = 0;
            _mm_insert_epi64_rpl(a_18,alVar18[1],end_ref);
            b_09[1] = (long)piVar2[iVar1 * local_ac8 + ptr_00[(long)end_ref + 1]];
            a_19[1] = (long)(end_ref + -1);
            a_19[0] = iVar12;
            b_09[0] = ptr_00[a_19[1] + 1];
            alVar18 = _mm_max_epi64_rpl(a_19,b_09);
            b_10[0] = alVar18[1];
            a_20[1] = a_19[1];
            a_20[0] = iVar12;
            b_10[1] = b_09[1];
            alVar18 = _mm_max_epi64_rpl(a_20,b_10);
            b_11[0] = alVar18[1];
            a_21[1] = a_19[1];
            a_21[0] = iVar12;
            b_11[1] = b_09[1];
            alVar18 = _mm_cmpeq_epi64_rpl(a_21,b_11);
            b_12[0] = alVar18[1];
            a_22[1] = a_19[1];
            a_22[0] = iVar12;
            b_12[1] = b_09[1];
            alVar18 = _mm_cmpeq_epi64_rpl(a_22,b_12);
            b_13[0] = alVar18[1];
            a_23[1] = a_19[1];
            a_23[0] = iVar12;
            b_13[1] = b_09[1];
            mask_05[1] = uVar16;
            mask_05[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_23,b_13,mask_05);
            b_14[0] = alVar18[1];
            a_24[1] = a_19[1];
            a_24[0] = iVar12;
            b_14[1] = b_09[1];
            alVar18 = _mm_cmpeq_epi64_rpl(a_24,b_14);
            b_15[0] = alVar18[1];
            a_25[1] = a_19[1];
            a_25[0] = iVar12;
            b_15[1] = b_09[1];
            mask_06[1] = uVar16;
            mask_06[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_25,b_15,mask_06);
            b_16[0] = alVar18[1];
            a_26[1] = a_19[1];
            a_26[0] = iVar12;
            b_16[1] = b_09[1];
            mask_07[1] = uVar16;
            mask_07[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_26,b_16,mask_07);
            b_17[0] = alVar18[1];
            a_27[1] = a_19[1];
            a_27[0] = iVar12;
            b_17[1] = b_09[1];
            alVar18 = _mm_cmpgt_epi64_rpl(a_27,b_17);
            b_18[0] = alVar18[1];
            a_28[1] = a_19[1];
            a_28[0] = iVar12;
            b_18[1] = b_09[1];
            mask_08[1] = uVar16;
            mask_08[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_28,b_18,mask_08);
            b_19[0] = alVar18[1];
            a_29[1] = a_19[1];
            a_29[0] = iVar12;
            b_19[1] = b_09[1];
            mask_09[1] = uVar16;
            mask_09[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_29,b_19,mask_09);
            b_20[0] = alVar18[1];
            a_30[1] = a_19[1];
            a_30[0] = iVar12;
            b_20[1] = b_09[1];
            mask_10[1] = uVar16;
            mask_10[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_30,b_20,mask_10);
            b_21[0] = alVar18[1];
            a_31[1] = a_19[1];
            a_31[0] = iVar12;
            b_21[1] = b_09[1];
            alVar18 = _mm_cmpeq_epi64_rpl(a_31,b_21);
            b_22[0] = alVar18[1];
            a_32[1] = a_19[1];
            a_32[0] = iVar12;
            b_22[1] = b_09[1];
            mask_11[1] = uVar16;
            mask_11[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_32,b_22,mask_11);
            b_23[0] = alVar18[1];
            a_33[1] = a_19[1];
            a_33[0] = iVar12;
            b_23[1] = b_09[1];
            mask_12[1] = uVar16;
            mask_12[0] = uVar15;
            alVar18 = _mm_blendv_epi8_rpl(a_33,b_23,mask_12);
            b_24[0] = alVar18[1];
            if (1 < end_ref) {
              a_34[1] = a_19[1];
              a_34[0] = iVar12;
              b_24[1] = b_09[1];
              alVar18 = _mm_min_epi64_rpl(a_34,b_24);
              b_25[0] = alVar18[1];
              a_35[1] = a_19[1];
              a_35[0] = iVar12;
              b_25[1] = b_09[1];
              alVar18 = _mm_max_epi64_rpl(a_35,b_25);
              b_26[0] = alVar18[1];
              a_36[1] = a_19[1];
              a_36[0] = iVar12;
              b_26[1] = b_09[1];
              alVar18 = _mm_max_epi64_rpl(a_36,b_26);
              b_27[0] = alVar18[1];
              a_37[1] = a_19[1];
              a_37[0] = iVar12;
              b_27[1] = b_09[1];
              alVar18 = _mm_max_epi64_rpl(a_37,b_27);
              b_28[0] = alVar18[1];
              a_38[1] = a_19[1];
              a_38[0] = iVar12;
              b_28[1] = b_09[1];
              alVar18 = _mm_max_epi64_rpl(a_38,b_28);
              b_29[0] = alVar18[1];
              a_39[1] = a_19[1];
              a_39[0] = iVar12;
              b_29[1] = b_09[1];
              _mm_max_epi64_rpl(a_39,b_29);
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_aa4;
            vWH_00[1]._4_4_ = 0;
            arr_store_rowcol(*((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table,
                             *(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                             trace_del_table + 0x20),vWH_00,end_ref,s2Len,
                             (int32_t)in_stack_fffffffffffff498,(int32_t)in_stack_fffffffffffff4a0);
            vWH_01[0] = (ulong)(uint)end_query;
            vWH_01[1]._0_4_ = local_aa4;
            vWH_01[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                             trace_del_table + 8),
                             *(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                             trace_del_table + 0x28),vWH_01,end_ref,s2Len,
                             (int32_t)in_stack_fffffffffffff498,(int32_t)in_stack_fffffffffffff4a0);
            vWH_02[0] = (ulong)(uint)end_query;
            vWH_02[1]._0_4_ = local_aa4;
            vWH_02[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                             trace_del_table + 0x10),
                             *(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                             trace_del_table + 0x30),vWH_02,end_ref,s2Len,
                             (int32_t)in_stack_fffffffffffff498,(int32_t)in_stack_fffffffffffff4a0);
            col = *(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                  trace_del_table + 0x38);
            vWH_03[0] = (ulong)(uint)end_query;
            uVar15 = (ulong)(uint)end_ref;
            uVar16 = (ulong)(uint)s2Len;
            vWH_03[1]._0_4_ = local_aa4;
            vWH_03[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                             trace_del_table + 0x18),col,vWH_03,end_ref,s2Len,
                             (int32_t)in_stack_fffffffffffff498,(int32_t)in_stack_fffffffffffff4a0);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = col;
            iVar12 = _mm_extract_epi64_rpl((__m128i)(auVar3 << 0x40),imm);
            ptr_01[(long)(end_ref + -1) + 1] = iVar12;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = col;
            iVar12 = _mm_extract_epi64_rpl((__m128i)(auVar4 << 0x40),(int)iVar12);
            ptr_02[(long)(end_ref + -1) + 1] = iVar12;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = col;
            iVar12 = _mm_extract_epi64_rpl((__m128i)(auVar5 << 0x40),(int)iVar12);
            ptr_03[(long)(end_ref + -1) + 1] = iVar12;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = col;
            iVar12 = _mm_extract_epi64_rpl((__m128i)(auVar6 << 0x40),(int)iVar12);
            ptr_04[(long)(end_ref + -1) + 1] = iVar12;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = col;
            iVar12 = _mm_extract_epi64_rpl((__m128i)(auVar7 << 0x40),(int)iVar12);
            ptr_05[(long)(end_ref + -1) + 1] = iVar12;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = col;
            iVar12 = _mm_extract_epi64_rpl((__m128i)(auVar8 << 0x40),(int)iVar12);
            ptr_06[(long)(end_ref + -1) + 1] = iVar12;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = col;
            iVar12 = _mm_extract_epi64_rpl((__m128i)(auVar9 << 0x40),(int)iVar12);
            ptr_07[(long)(end_ref + -1) + 1] = iVar12;
            alVar18[0] = 0;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = col;
            iVar12 = _mm_extract_epi64_rpl((__m128i)(auVar10 << 0x40),(int)iVar12);
            b_30[1] = (long)(end_ref + -1);
            ptr_08[b_30[1] + 1] = iVar12;
            a_40[1] = (longlong)col;
            a_40[0] = alVar18[0];
            b_30[0] = iVar12;
            alVar17 = _mm_cmpeq_epi64_rpl(a_40,b_30);
            b_31[0] = alVar17[1];
            a_41[1] = (longlong)col;
            a_41[0] = alVar18[0];
            b_31[1] = b_30[1];
            alVar17 = _mm_cmpeq_epi64_rpl(a_41,b_31);
            b_32[0] = alVar17[1];
            a_42[1] = (longlong)col;
            a_42[0] = alVar18[0];
            b_32[1] = b_30[1];
            mask_13[1] = uVar16;
            mask_13[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_42,b_32,mask_13);
            b_33[0] = alVar17[1];
            a_43[1] = (longlong)col;
            a_43[0] = alVar18[0];
            b_33[1] = b_30[1];
            mask_14[1] = uVar16;
            mask_14[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_43,b_33,mask_14);
            b_34[0] = alVar17[1];
            a_44[1] = (longlong)col;
            a_44[0] = alVar18[0];
            b_34[1] = b_30[1];
            mask_15[1] = uVar16;
            mask_15[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_44,b_34,mask_15);
            b_35[0] = alVar17[1];
            a_45[1] = (longlong)col;
            a_45[0] = alVar18[0];
            b_35[1] = b_30[1];
            mask_16[1] = uVar16;
            mask_16[0] = uVar15;
            alVar17 = _mm_blendv_epi8_rpl(a_45,b_35,mask_16);
            b_09[1] = alVar17[1];
          }
        }
        end_query = 0;
        length = local_6e0;
        similar = local_6e0;
        matches = local_6e0;
        while( true ) {
          if (1 < end_query) break;
          a_46[1] = (longlong)col;
          a_46[0] = 1;
          alVar18[0] = 1;
          iVar12 = _mm_extract_epi64_rpl(a_46,(int)b_09[1]);
          b_09[1] = extraout_RDX_00;
          if (matches < iVar12) {
            a_47[1] = (longlong)col;
            a_47[0] = 1;
            similar = _mm_extract_epi64_rpl(a_47,(int)extraout_RDX_00);
            a_48[1] = (longlong)col;
            a_48[0] = 1;
            length = _mm_extract_epi64_rpl(a_48,imm_00);
            a_49[1] = (longlong)col;
            a_49[0] = 1;
            alVar18[0] = 1;
            local_6e0 = _mm_extract_epi64_rpl(a_49,imm_01);
            b_09[1] = extraout_RDX_01;
            matches = iVar12;
          }
          end_query = end_query + 1;
        }
        a_50[1] = (longlong)col;
        a_50[0] = alVar18[0];
        b_36[1] = uVar13;
        b_36[0] = b_09[1];
        alVar17 = _mm_cmplt_epi64_rpl(a_50,b_36);
        b_37[0] = alVar17[1];
        a_51[1] = (longlong)col;
        a_51[0] = alVar18[0];
        b_37[1] = uVar13;
        uVar15 = extraout_XMM0_Qa;
        uVar16 = extraout_XMM0_Qb;
        _mm_cmpgt_epi64_rpl(a_51,b_37);
        uVar16 = uVar16 | extraout_XMM0_Qb_00;
        auVar11._8_8_ = uVar16;
        auVar11._0_8_ = uVar15 | extraout_XMM0_Qa_00;
        if ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar11 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar11 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar11 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar11 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar11 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar16 >> 7 & 1) != 0) || (uVar16 >> 0xf & 1) != 0) || (uVar16 >> 0x17 & 1) != 0)
               || (uVar16 >> 0x1f & 1) != 0) || (uVar16 >> 0x27 & 1) != 0) ||
             (uVar16 >> 0x2f & 1) != 0) || (uVar16 >> 0x37 & 1) != 0) || (long)uVar16 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          matches = 0;
          similar._0_4_ = 0;
          length._0_4_ = 0;
          local_6e0._0_4_ = 0;
          NEG_LIMIT._4_4_ = 0;
          NEG_LIMIT._0_4_ = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)matches;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT._4_4_;
        ((parasail_result_t *)_s1_local)->end_ref = (int)NEG_LIMIT;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->matches = (int)similar;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->similar = (int)length;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->length = (int)local_6e0;
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vNegInf0 = _mm_insert_epi64_rpl(vZero, NEG_LIMIT, 1);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_insert_epi64_rpl(vWH, -open - i*gap, 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vNM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vNS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vWM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vWS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64_rpl(vWH, vNWH);
            case2 = _mm_cmpeq_epi64_rpl(vWH, vF);
            vWM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64_rpl(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi64_rpl(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8_rpl(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8_rpl(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8_rpl(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
            similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
            length= (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
        }
        vMaxH = _mm_slli_si128(vMaxH, 8);
        vMaxM = _mm_slli_si128(vMaxM, 8);
        vMaxS = _mm_slli_si128(vMaxS, 8);
        vMaxL = _mm_slli_si128(vMaxL, 8);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}